

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::~ConcreteMachine
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this)

{
  long lVar1;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005868e0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005869a8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005869f0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00586a08;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00586a40;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00586a58;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00586a88;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00586ac8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00586ae0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00586b00;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00586b18;
  (this->super_MemorySlotChangeHandler)._vptr_MemorySlotChangeHandler = (_func_int **)&DAT_00586b30;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&(this->speaker_).audio_queue);
  std::__cxx11::string::~string((string *)&this->input_text_);
  lVar1 = 0;
  do {
    HandledSlot::~HandledSlot
              ((HandledSlot *)
               ((long)this->memory_slots_[3].super_PrimarySlot.subslots_[0].read_pointers_ +
               lVar1 + -0x20));
    lVar1 = lVar1 + -0x2a0;
  } while (lVar1 != -0xa80);
  AYPortHandler::~AYPortHandler(&this->ay_port_handler_);
  Speaker<false>::~Speaker(&this->speaker_);
  Storage::Tape::TapePlayer::~TapePlayer(&(this->tape_player_).super_TapePlayer);
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::~JustInTimeActor
            (&this->vdp_);
  CPU::Z80::ProcessorStorage::~ProcessorStorage((ProcessorStorage *)&this->z80_);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  return;
}

Assistant:

~ConcreteMachine() {
			speaker_.audio_queue.flush();
		}